

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall
IR::Instr::HoistSrc2(Instr *this,OpCode assignOpcode,RegNum regNum,StackSym *newSym)

{
  IRType type_00;
  bool bVar1;
  ValueType valueType;
  Opnd *this_00;
  RegOpnd *pRVar2;
  Opnd *this_01;
  Instr *instr;
  IntConstOpnd *pIVar3;
  long value;
  bool creatingNewSym;
  IRType type;
  Instr *newInstr;
  Opnd *newSrc;
  Opnd *oldSrc;
  StackSym *newSym_local;
  RegNum regNum_local;
  OpCode assignOpcode_local;
  Instr *this_local;
  
  this_00 = UnlinkSrc2(this);
  type_00 = Opnd::GetType(this_00);
  oldSrc = (Opnd *)newSym;
  if (newSym == (StackSym *)0x0) {
    oldSrc = (Opnd *)StackSym::New(type_00,this->m_func);
  }
  pRVar2 = RegOpnd::New((StackSym *)oldSrc,regNum,type_00,this->m_func);
  this_01 = SetSrc2(this,&pRVar2->super_Opnd);
  valueType = Opnd::GetValueType(this_00);
  Opnd::SetValueType(this_01,valueType);
  instr = New(assignOpcode,this_01,this_00,this->m_func);
  InsertBefore(this,instr);
  if (newSym == (StackSym *)0x0) {
    bVar1 = Opnd::IsRegOpnd(this_00);
    if (bVar1) {
      pRVar2 = Opnd::AsRegOpnd(this_00);
      StackSym::CopySymAttrs((StackSym *)oldSrc,pRVar2->m_sym);
    }
    else {
      bVar1 = Opnd::IsIntConstOpnd(this_00);
      if (bVar1) {
        pIVar3 = Opnd::AsIntConstOpnd(this_00);
        value = EncodableOpnd<long>::GetValue(&pIVar3->super_EncodableOpnd<long>);
        StackSym::SetIsIntConst((StackSym *)oldSrc,value);
      }
    }
  }
  return instr;
}

Assistant:

Instr *
Instr::HoistSrc2(Js::OpCode assignOpcode, RegNum regNum, StackSym *newSym)
{
    Opnd *oldSrc, *newSrc;
    Instr * newInstr;
    IRType type;

    oldSrc = this->UnlinkSrc2();
    type = oldSrc->GetType();

    const bool creatingNewSym = !newSym;
    if(creatingNewSym)
    {
        newSym = StackSym::New(type, m_func);
    }
    newSrc = this->SetSrc2(RegOpnd::New(newSym, regNum, type, m_func));
    newSrc->SetValueType(oldSrc->GetValueType());

    newInstr = Instr::New(assignOpcode, newSrc, oldSrc, m_func);
    this->InsertBefore(newInstr);

    if(creatingNewSym)
    {
        if (oldSrc->IsRegOpnd())
        {
            newSym->CopySymAttrs(oldSrc->AsRegOpnd()->m_sym);
        }
        else if (oldSrc->IsIntConstOpnd())
        {
            newSym->SetIsIntConst(oldSrc->AsIntConstOpnd()->GetValue());
        }
    }

    return newInstr;
}